

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rasterizer.hpp
# Opt level: O3

void __thiscall
eos::render::Rasterizer<eos::render::TexturingFragmentShader>::raster_triangle<float>
          (Rasterizer<eos::render::TexturingFragmentShader> *this,Vertex<float> *point_a,
          Vertex<float> *point_b,Vertex<float> *point_c,optional<eos::render::Texture> *texture)

{
  char cVar1;
  int *piVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  float fVar9;
  PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *pPVar10;
  Image<eos::core::Pixel<unsigned_char,_4>_> *this_00;
  double *pdVar11;
  Pixel<unsigned_char,_4> *pPVar12;
  int iVar13;
  int pixel_index_col;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  double dVar24;
  double dVar26;
  undefined1 auVar25 [16];
  float fVar27;
  double dVar28;
  double dVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  double dVar35;
  Rect<int> RVar36;
  ulong local_1b8;
  plane gamma_plane;
  plane beta_plane;
  undefined1 local_178 [16];
  plane alpha_plane;
  Vector3<float> local_148;
  float fStack_13c;
  ulong local_130;
  Image<double> *local_128;
  Vertex<float> *local_120;
  double local_118;
  ulong local_110;
  Image<eos::core::Pixel<unsigned_char,_4>_> *local_108;
  Vertex<float> *local_100;
  Vertex<float> *local_f8;
  optional<eos::render::Texture> *local_f0;
  double local_e8;
  undefined8 uStack_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  float local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  float local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  float local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  Vector3<float> local_40;
  
  pPVar10 = &(point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  alpha_plane.a = (pPVar10->m_storage).m_data.array[0];
  alpha_plane.b = (pPVar10->m_storage).m_data.array[1];
  pPVar10 = &(point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  beta_plane.a = (pPVar10->m_storage).m_data.array[0];
  beta_plane.b = (pPVar10->m_storage).m_data.array[1];
  pPVar10 = &(point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  gamma_plane.a = (pPVar10->m_storage).m_data.array[0];
  gamma_plane.b = (pPVar10->m_storage).m_data.array[1];
  RVar36 = detail::calculate_clipped_bounding_box<float>
                     ((Vector2<float> *)&alpha_plane,(Vector2<float> *)&beta_plane,
                      (Vector2<float> *)&gamma_plane,this->viewport_width,this->viewport_height);
  local_130 = RVar36._0_8_;
  beta_plane.c = (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.
                 m_storage.m_data.array[0] *
                 (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                 m_storage.m_data.array[3];
  pPVar10 = &(point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  beta_plane.a = (pPVar10->m_storage).m_data.array[0];
  beta_plane.b = (pPVar10->m_storage).m_data.array[1];
  gamma_plane.c =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  pPVar10 = &(point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  gamma_plane.a = (pPVar10->m_storage).m_data.array[0];
  gamma_plane.b = (pPVar10->m_storage).m_data.array[1];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[0] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  detail::plane::plane<float>
            (&alpha_plane,(Vector3<float> *)&beta_plane,(Vector3<float> *)&gamma_plane,&local_148);
  gamma_plane.c =
       (point_a->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  pPVar10 = &(point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
  gamma_plane.a = (pPVar10->m_storage).m_data.array[0];
  gamma_plane.b = (pPVar10->m_storage).m_data.array[1];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_b->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  local_178._8_4_ =
       (point_c->texcoords).super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
       m_data.array[1] *
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178._0_8_ =
       *(undefined8 *)
        (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
        m_data.array;
  detail::plane::plane<float>
            (&beta_plane,(Vector3<float> *)&gamma_plane,&local_148,(Vector3<float> *)local_178);
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_a->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_178._0_8_ =
       *(undefined8 *)
        (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
        m_data.array;
  local_178._8_4_ =
       (point_b->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  local_40.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_8_
       = *(undefined8 *)
          (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
          m_data.array;
  local_40.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (point_c->position).super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[3];
  detail::plane::plane<float>(&gamma_plane,&local_148,(Vector3<float> *)local_178,&local_40);
  if (-1 < RVar36._8_8_) {
    fVar23 = 1.0 / alpha_plane.c;
    fVar27 = 1.0 / beta_plane.c;
    fVar19 = 1.0 / gamma_plane.c;
    local_88 = -alpha_plane.a * fVar23;
    uStack_84 = 0x80000000;
    uStack_80 = 0x80000000;
    uStack_7c = 0x80000000;
    local_a8 = -beta_plane.a * fVar27;
    uStack_a4 = 0x80000000;
    uStack_a0 = 0x80000000;
    uStack_9c = 0x80000000;
    local_c8 = -gamma_plane.a * fVar19;
    uStack_c4 = 0x80000000;
    uStack_c0 = 0x80000000;
    uStack_bc = 0x80000000;
    local_98 = -alpha_plane.b * fVar23;
    uStack_94 = 0x80000000;
    uStack_90 = 0x80000000;
    uStack_8c = 0x80000000;
    local_b8 = -beta_plane.b * fVar27;
    uStack_b4 = 0x80000000;
    uStack_b0 = 0x80000000;
    uStack_ac = 0x80000000;
    local_d8 = -gamma_plane.b * fVar19;
    uStack_d4 = 0x80000000;
    uStack_d0 = 0x80000000;
    uStack_cc = 0x80000000;
    iVar13 = (int)(local_130 >> 0x20);
    uVar16 = RVar36.height + iVar13;
    iVar14 = (int)local_130;
    iVar17 = iVar14 + RVar36.width;
    local_128 = &this->depthbuffer;
    if (iVar17 <= iVar14) {
      iVar17 = iVar14;
    }
    local_108 = &this->colorbuffer;
    local_110 = (ulong)uVar16;
    if ((int)uVar16 <= iVar13) {
      local_110 = local_130 >> 0x20;
    }
    local_1b8 = local_130 >> 0x20;
    local_120 = point_a;
    local_100 = point_b;
    local_f8 = point_c;
    local_f0 = texture;
    do {
      if (-1 < RVar36.width) {
        fVar20 = (float)(int)local_1b8 + 0.5;
        dVar6 = (double)fVar20;
        local_58._8_4_ = SUB84(dVar6,0);
        local_58._0_8_ = dVar6;
        local_58._12_4_ = (int)((ulong)dVar6 >> 0x20);
        uVar15 = local_130 & 0xffffffff;
        uStack_e0 = 0;
        local_e8 = dVar6;
        do {
          iVar14 = (int)uVar15;
          fVar34 = (float)iVar14 + 0.5;
          dVar7 = (double)fVar34;
          dVar24 = (double)(point_b->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar26 = (double)(point_c->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar3 = (double)(point_c->position).
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[0];
          dVar4 = (double)(point_a->position).
                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[0];
          dVar28 = (double)(point_b->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[0];
          dVar29 = (double)(point_a->position).
                           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[1];
          dVar35 = ((dVar29 - dVar24) * dVar7 + (dVar28 - dVar4) * dVar6 + dVar4 * dVar24 +
                   -dVar28 * dVar29) *
                   (1.0 / ((dVar29 - dVar24) * dVar3 + dVar26 * (dVar28 - dVar4) + dVar4 * dVar24 +
                          -dVar28 * dVar29));
          if (0.0 <= dVar35) {
            dVar5 = dVar28 * (dVar26 - dVar29) + dVar24 * (dVar4 - dVar3) + dVar3 * dVar29 +
                    -dVar4 * dVar26;
            auVar25._8_4_ = SUB84(dVar5,0);
            auVar25._0_8_ =
                 dVar4 * (dVar24 - dVar26) + dVar29 * (dVar3 - dVar28) + dVar26 * dVar28 +
                 -dVar3 * dVar24;
            auVar25._12_4_ = (int)((ulong)dVar5 >> 0x20);
            auVar25 = divpd(_DAT_0018f1d0,auVar25);
            dVar24 = (dVar7 * (dVar24 - dVar26) + (dVar3 - dVar28) * (double)local_58._0_8_ +
                      dVar26 * dVar28 + -dVar3 * dVar24) * auVar25._0_8_;
            dVar3 = (dVar7 * (dVar26 - dVar29) + (dVar4 - dVar3) * (double)local_58._8_8_ +
                     dVar3 * dVar29 + -dVar4 * dVar26) * auVar25._8_8_;
            if ((0.0 <= dVar3) && (0.0 <= dVar24)) {
              local_118 = (double)(point_c->position).
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[2] * dVar35 +
                          (double)(point_a->position).
                                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                  m_storage.m_data.array[2] * dVar24 +
                          dVar3 * (double)(point_b->position).
                                          super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>
                                          .m_storage.m_data.array[2];
              cVar1 = this->enable_depth_test;
              if ((bool)cVar1 == true) {
                bVar8 = 1.0 < local_118;
                bVar18 = this->enable_far_clipping;
                local_68._8_4_ = SUB84(dVar3,0);
                local_68._0_8_ = dVar24;
                local_68._12_4_ = (int)((ulong)dVar3 >> 0x20);
                local_78 = dVar35;
                dStack_70 = dVar29;
                pdVar11 = core::Image<double>::operator()(local_128,(int)local_1b8,iVar14);
                point_a = local_120;
                dVar35 = local_78;
                dVar24 = (double)local_68._0_8_;
                dVar3 = (double)local_68._8_8_;
                if ((byte)(*pdVar11 <= local_118 | bVar8 & bVar18) == 1) {
                  cVar1 = this->enable_depth_test;
                  dVar6 = local_e8;
                  goto joined_r0x00188fd6;
                }
              }
              else {
joined_r0x00188fd6:
                if (cVar1 != '\0') goto LAB_00189323;
              }
              if (this->perspective_correct_barycentric_weights == true) {
                dVar26 = (double)(point_c->position).
                                 super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                 m_storage.m_data.array[3];
                dVar6 = (double)(point_a->position).
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                m_storage.m_data.array[3];
                dVar4 = (double)(point_b->position).
                                super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
                                m_storage.m_data.array[3];
                dVar7 = 1.0 / (dVar35 * dVar26 + dVar24 * dVar6 + dVar3 * dVar4);
                dVar24 = dVar24 * dVar7 * dVar6;
                dVar3 = dVar3 * dVar7 * dVar4;
                dVar35 = dVar35 * dVar7 * dVar26;
              }
              local_178._8_4_ = (undefined4)dVar35;
              local_178._0_8_ = CONCAT44((float)dVar3,(float)dVar24);
              if ((texture->super__Optional_base<eos::render::Texture,_false,_false>)._M_payload.
                  super__Optional_payload<eos::render::Texture,_true,_false,_false>.
                  super__Optional_payload_base<eos::render::Texture>._M_engaged == true) {
                fVar21 = -(gamma_plane.a * fVar34 + gamma_plane.b * fVar20 + gamma_plane.d) * fVar19
                ;
                fVar30 = (beta_plane.a * fVar34 + beta_plane.b * fVar20 + beta_plane.d) * fVar27;
                fVar9 = 1.0 / (fVar21 * fVar21);
                fVar33 = (alpha_plane.a * fVar34 + alpha_plane.b * fVar20 + alpha_plane.d) * fVar23;
                piVar2 = *(int **)&(texture->
                                   super__Optional_base<eos::render::Texture,_false,_false>).
                                   _M_payload.
                                   super__Optional_payload<eos::render::Texture,_true,_false,_false>
                                   .super__Optional_payload_base<eos::render::Texture>._M_payload.
                                   _M_value.mipmaps.
                                   super__Vector_base<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>,_std::allocator<eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>_>_>
                ;
                fVar31 = (float)piVar2[1];
                fVar22 = (fVar21 * local_88 + fVar33 * local_c8) * fVar9 * fVar31;
                fVar31 = (local_a8 * fVar21 + fVar30 * local_c8) * fVar9 * fVar31;
                fVar32 = (float)*piVar2;
                fVar33 = (local_98 * fVar21 + local_d8 * fVar33) * fVar9 * fVar32;
                fVar32 = (local_b8 * fVar21 + local_d8 * fVar30) * fVar9 * fVar32;
              }
              else {
                fVar22 = 0.0;
                fVar31 = 0.0;
                fVar33 = 0.0;
                fVar32 = 0.0;
              }
              TexturingFragmentShader::shade_triangle_pixel<float>
                        ((TexturingFragmentShader *)&local_148,(int)this,(int)fVar34,
                         (Vertex<float> *)(ulong)(uint)(int)fVar20,point_a,point_b,
                         (Vector3<float> *)point_c,(optional<eos::render::Texture> *)local_178,
                         fVar22,fVar31,fVar33,fVar32);
              this_00 = local_108;
              fVar34 = 1.0;
              if (local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[0] <= 1.0) {
                fVar34 = local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[0];
              }
              fVar22 = 1.0;
              if (local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1] <= 1.0) {
                fVar22 = local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[1];
              }
              fVar31 = 1.0;
              if (local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[2] <= 1.0) {
                fVar31 = local_148.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                         m_storage.m_data.array[2];
              }
              fVar33 = 1.0;
              if (fStack_13c <= 1.0) {
                fVar33 = fStack_13c;
              }
              pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (local_108,(int)local_1b8,iVar14);
              (pPVar12->data_)._M_elems[0] = (uchar)(int)(fVar31 * 255.0);
              pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (this_00,(int)local_1b8,iVar14);
              (pPVar12->data_)._M_elems[1] = (uchar)(int)(fVar22 * 255.0);
              pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (this_00,(int)local_1b8,iVar14);
              (pPVar12->data_)._M_elems[2] = (uchar)(int)(fVar34 * 255.0);
              pPVar12 = core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
                                  (this_00,(int)local_1b8,iVar14);
              (pPVar12->data_)._M_elems[3] = (uchar)(int)(fVar33 * 255.0);
              point_a = local_120;
              point_b = local_100;
              texture = local_f0;
              point_c = local_f8;
              dVar6 = local_e8;
              if (this->enable_depth_test == true) {
                pdVar11 = core::Image<double>::operator()(local_128,(int)local_1b8,iVar14);
                *pdVar11 = local_118;
                point_a = local_120;
                point_b = local_100;
                texture = local_f0;
                point_c = local_f8;
                dVar6 = local_e8;
              }
            }
          }
LAB_00189323:
          uVar15 = (ulong)(iVar14 + 1U);
        } while (iVar17 + 1U != iVar14 + 1U);
      }
      bVar18 = (int)local_1b8 != (int)local_110;
      local_1b8 = (ulong)((int)local_1b8 + 1);
    } while (bVar18);
  }
  return;
}

Assistant:

void raster_triangle(const detail::Vertex<T>& point_a, const detail::Vertex<T>& point_b,
                         const detail::Vertex<T>& point_c, const cpp17::optional<Texture>& texture)
    {
        // We already calculated this in the culling/clipping stage. Maybe we should save/cache it after all.
        const auto boundingBox = detail::calculate_clipped_bounding_box(
            Eigen::Vector2<T>(point_a.position.x(), point_a.position.y()),
            Eigen::Vector2<T>(point_b.position.x(), point_b.position.y()),
            Eigen::Vector2<T>(point_c.position.x(), point_c.position.y()), viewport_width, viewport_height);
        const auto min_x = boundingBox.x;
        const auto max_x = boundingBox.x + boundingBox.width;
        const auto min_y = boundingBox.y;
        const auto max_y = boundingBox.y + boundingBox.height;

        // These are triangle-specific, i.e. calculate once per triangle.
        // These ones are needed for perspective correct lambdas! (as well as mipmapping)
        const auto& one_over_w0 = point_a.position[3];
        const auto& one_over_w1 = point_b.position[3];
        const auto& one_over_w2 = point_c.position[3];

        // These are triangle-specific, i.e. calculate once per triangle.
        // For partial derivatives computation (for mipmapping, texturing) (they work on screen-space coords):
        using eos::render::detail::plane;
        const auto alpha_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[0] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[0] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[0] * one_over_w2));
        const auto beta_plane = plane(
            Eigen::Vector3<T>(point_a.position[0], point_a.position[1], point_a.texcoords[1] * one_over_w0),
            Eigen::Vector3<T>(point_b.position[0], point_b.position[1], point_b.texcoords[1] * one_over_w1),
            Eigen::Vector3<T>(point_c.position[0], point_c.position[1], point_c.texcoords[1] * one_over_w2));
        const auto gamma_plane =
            plane(Eigen::Vector3<T>(point_a.position[0], point_a.position[1], one_over_w0),
                  Eigen::Vector3<T>(point_b.position[0], point_b.position[1], one_over_w1),
                  Eigen::Vector3<T>(point_c.position[0], point_c.position[1], one_over_w2));
        const auto one_over_alpha_c = 1.0f / alpha_plane.c;
        const auto one_over_beta_c = 1.0f / beta_plane.c;
        const auto one_over_gamma_c = 1.0f / gamma_plane.c;
        const auto alpha_ffx = -alpha_plane.a * one_over_alpha_c;
        const auto beta_ffx = -beta_plane.a * one_over_beta_c;
        const auto gamma_ffx = -gamma_plane.a * one_over_gamma_c;
        const auto alpha_ffy = -alpha_plane.b * one_over_alpha_c;
        const auto beta_ffy = -beta_plane.b * one_over_beta_c;
        const auto gamma_ffy = -gamma_plane.b * one_over_gamma_c;

        for (int yi = min_y; yi <= max_y; ++yi)
        {
            for (int xi = min_x; xi <= max_x; ++xi)
            {
                // we want centers of pixels to be used in computations. Todo: Do we? Do we pass it with or
                // without +0.5 to the FragShader?
                const float x = static_cast<float>(xi) + 0.5f; // double? T?
                const float y = static_cast<float>(yi) + 0.5f;

                // These will be used for barycentric weights computation
                using detail::implicit_line;
                const double one_over_v0ToLine12 =
                    1.0 / implicit_line(point_a.position[0], point_a.position[1], point_b.position,
                                        point_c.position);
                const double one_over_v1ToLine20 =
                    1.0 / implicit_line(point_b.position[0], point_b.position[1], point_c.position,
                                        point_a.position);
                const double one_over_v2ToLine01 =
                    1.0 / implicit_line(point_c.position[0], point_c.position[1], point_a.position,
                                        point_b.position);
                // Affine barycentric weights:
                double alpha = implicit_line(x, y, point_b.position, point_c.position) * one_over_v0ToLine12;
                double beta = implicit_line(x, y, point_c.position, point_a.position) * one_over_v1ToLine20;
                double gamma = implicit_line(x, y, point_a.position, point_b.position) * one_over_v2ToLine01;

                // if pixel (x, y) is inside the triangle or on one of its edges
                if (alpha >= 0 && beta >= 0 && gamma >= 0)
                {
                    const int pixel_index_row = yi;
                    const int pixel_index_col = xi;

                    // TODO: Check this one. What about perspective?
                    const double z_affine = alpha * static_cast<double>(point_a.position[2]) +
                                            beta * static_cast<double>(point_b.position[2]) +
                                            gamma * static_cast<double>(point_c.position[2]);

                    bool draw = true;
                    if (enable_far_clipping)
                    {
                        if (z_affine > 1.0)
                        {
                            draw = false;
                        }
                    }

                    bool passes_depth_test = false;
                    if (enable_depth_test)
                    {
                        // If enable_depth_test=false, avoid accessing the depthbuffer at all - it might be
                        // empty or have other dimensions.
                        passes_depth_test =
                            (z_affine < depthbuffer(pixel_index_row, pixel_index_col));
                    }
                    // The '<= 1.0' clips against the far-plane in NDC. We clip against the near-plane
                    // earlier.
                    // if (z_affine < depthbuffer.at<double>(pixelIndexRow, pixelIndexCol)/* && z_affine <=
                    // 1.0*/) // what to do in ortho case without n/f "squashing"? should we always squash? or
                    // a flag?
                    if ((passes_depth_test && draw) || enable_depth_test == false)
                    {
                        // perspective-correct barycentric weights
                        // Todo: Check this in the original/older implementation, i.e. if all is still
                        //   perspective-correct. I think so. Also compare 1:1 with OpenGL.
                        // This is the default case when rendering - we perspectively correct the barycentric
                        //   weights. However when extracting texture, it seems we don't want to do that, and
                        //   pass the uncorrected lambda in that case. This switch allows us to do that.
                        if (perspective_correct_barycentric_weights)
                        {
                            double d = alpha * one_over_w0 + beta * one_over_w1 + gamma * one_over_w2;
                            d = 1.0 / d;
                            alpha *= d * one_over_w0; // In case of affine cam matrix, everything is 1 and
                                                      // a/b/g don't get changed.
                            beta *= d * one_over_w1;
                            gamma *= d * one_over_w2;
                        }
                        Eigen::Vector3<T> lambda(alpha, beta, gamma);

                        Eigen::Vector4<T> pixel_color;
                        if (texture)
                        {
                            // check if texture != NULL?
                            // partial derivatives (for mip-mapping, not needed for texturing otherwise!)
                            const float u_over_z =
                                -(alpha_plane.a * x + alpha_plane.b * y + alpha_plane.d) * one_over_alpha_c;
                            const float v_over_z =
                                -(beta_plane.a * x + beta_plane.b * y + beta_plane.d) * one_over_beta_c;
                            const float one_over_z =
                                -(gamma_plane.a * x + gamma_plane.b * y + gamma_plane.d) * one_over_gamma_c;
                            const float one_over_squared_one_over_z = 1.0f / std::pow(one_over_z, 2);

                            // partial derivatives of U/V coordinates with respect to X/Y pixel's screen
                            // coordinates
                            // These are exclusively used for the mipmap level computation (i.e. which mipmap
                            // levels to use).
                            // They're not needed for texturing otherwise at all!
                            float dudx =
                                one_over_squared_one_over_z * (alpha_ffx * one_over_z - u_over_z * gamma_ffx);
                            float dudy =
                                one_over_squared_one_over_z * (beta_ffx * one_over_z - v_over_z * gamma_ffx);
                            float dvdx =
                                one_over_squared_one_over_z * (alpha_ffy * one_over_z - u_over_z * gamma_ffy);
                            float dvdy =
                                one_over_squared_one_over_z * (beta_ffy * one_over_z - v_over_z * gamma_ffy);
                            dudx *= texture.value().mipmaps[0].width();
                            dudy *= texture.value().mipmaps[0].width();
                            dvdx *= texture.value().mipmaps[0].height();
                            dvdy *= texture.value().mipmaps[0].height();

                            // Why does it need x and y? Maybe some shaders (eg TexExtr?) need it?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, dudx, dudy, dvdx, dvdy);

                        } else
                        { // We use vertex-coloring
                            // Why does it need x and y?
                            pixel_color = fragment_shader.shade_triangle_pixel(
                                x, y, point_a, point_b, point_c, lambda, texture, 0, 0, 0, 0);
                        }

                        // clamp bytes to 255
                        // Todo: Proper casting (rounding?)? And we don't clamp/max against 255? Use
                        // glm::clamp?
                        const unsigned char red =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[0], T(1)));
                        const unsigned char green =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[1], T(1)));
                        const unsigned char blue =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[2], T(1)));
                        const unsigned char alpha =
                            static_cast<unsigned char>(255.0f * std::min(pixel_color[3], T(1)));

                        // update buffers
                        colorbuffer(pixel_index_row, pixel_index_col)[0] = blue;
                        colorbuffer(pixel_index_row, pixel_index_col)[1] = green;
                        colorbuffer(pixel_index_row, pixel_index_col)[2] = red;
                        colorbuffer(pixel_index_row, pixel_index_col)[3] = alpha;
                        if (enable_depth_test) // TODO: A better name for this might be enable_zbuffer? or
                                               // enable_zbuffer_test?
                        {
                            depthbuffer(pixel_index_row, pixel_index_col) = z_affine;
                        }
                    }
                }
            }
        }
    }